

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O0

void __thiscall
adios2::fstream::fstream
          (fstream *this,string *name,openmode mode,MPI_Comm comm,string *configFile,
          string *ioInConfigFile)

{
  undefined4 uVar1;
  Mode *in_RCX;
  undefined4 in_EDX;
  openmode in_EDI;
  Comm *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char (*unaff_retaddr) [4];
  ompi_communicator_t local_40 [8];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = adios2::fstream::ToMode(in_EDI);
  adios2::helper::CommDupMPI(local_40);
  std::
  make_shared<adios2::core::Stream,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[4]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,in_R8,in_R9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffc8),unaff_retaddr);
  adios2::helper::Comm::~Comm((Comm *)local_40);
  return;
}

Assistant:

fstream::fstream(const std::string &name, const openmode mode, MPI_Comm comm,
                 const std::string &configFile, const std::string ioInConfigFile)
: m_Stream(std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm), configFile,
                                          ioInConfigFile, "C++"))
{
}